

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O1

void crnlib::LzmaEnc_Init(CLzmaEnc *p)

{
  UInt16 *pUVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  UInt16 (*paUVar5) [64];
  uint uVar6;
  UInt16 (*paUVar7) [16];
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar19;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  lVar4 = 0;
  p->state = 0;
  p->reps[0] = 0;
  p->reps[1] = 0;
  p->reps[2] = 0;
  p->reps[3] = 0;
  (p->rc).low = 0;
  (p->rc).range = 0xffffffff;
  (p->rc).cacheSize = 1;
  (p->rc).cache = '\0';
  (p->rc).buf = (p->rc).bufBase;
  (p->rc).processed = 0;
  (p->rc).res = 0;
  paUVar7 = p->isRep0Long;
  do {
    lVar9 = 0;
    do {
      pUVar1 = paUVar7[-0xf] + lVar9;
      pUVar1[0] = 0x400;
      pUVar1[1] = 0x400;
      pUVar1[2] = 0x400;
      pUVar1[3] = 0x400;
      pUVar1[4] = 0x400;
      pUVar1[5] = 0x400;
      pUVar1[6] = 0x400;
      pUVar1[7] = 0x400;
      pUVar1 = *paUVar7 + lVar9;
      pUVar1[0] = 0x400;
      pUVar1[1] = 0x400;
      pUVar1[2] = 0x400;
      pUVar1[3] = 0x400;
      pUVar1[4] = 0x400;
      pUVar1[5] = 0x400;
      pUVar1[6] = 0x400;
      pUVar1[7] = 0x400;
      lVar9 = lVar9 + 8;
    } while (lVar9 != 0x10);
    p->isRep[lVar4] = 0x400;
    p->isRepG0[lVar4] = 0x400;
    p->isRepG1[lVar4] = 0x400;
    p->isRepG2[lVar4] = 0x400;
    lVar4 = lVar4 + 1;
    paUVar7 = paUVar7 + 1;
  } while (lVar4 != 0xc);
  uVar6 = p->lc + p->lp;
  if (uVar6 < 0x18) {
    iVar3 = 0x300 << ((byte)uVar6 & 0x1f);
    uVar8 = 0;
    do {
      p->litProbs[uVar8] = 0x400;
      uVar8 = uVar8 + 1;
    } while (iVar3 + (uint)(iVar3 == 0) != uVar8);
  }
  paUVar5 = p->posSlotEncoder;
  lVar4 = 0;
  do {
    lVar9 = 0;
    do {
      pUVar1 = *paUVar5 + lVar9;
      pUVar1[0] = 0x400;
      pUVar1[1] = 0x400;
      pUVar1[2] = 0x400;
      pUVar1[3] = 0x400;
      pUVar1[4] = 0x400;
      auVar2 = _DAT_001b10b0;
      pUVar1[5] = 0x400;
      pUVar1[6] = 0x400;
      pUVar1[7] = 0x400;
      lVar9 = lVar9 + 8;
    } while (lVar9 != 0x40);
    lVar4 = lVar4 + 1;
    paUVar5 = paUVar5 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  auVar10 = _DAT_001b1070;
  auVar11 = _DAT_001b1080;
  auVar12 = _DAT_001b1090;
  auVar13 = _DAT_001b10a0;
  do {
    auVar14 = auVar13 ^ auVar2;
    iVar3 = auVar14._0_4_;
    iVar19 = auVar14._8_4_;
    auVar20._4_4_ = iVar3;
    auVar20._0_4_ = iVar3;
    auVar20._8_4_ = iVar19;
    auVar20._12_4_ = iVar19;
    auVar24._0_4_ = -(uint)(iVar3 < -0x7fffff8e);
    auVar24._4_4_ = -(uint)(iVar3 < -0x7fffff8e);
    auVar24._8_4_ = -(uint)(iVar19 < -0x7fffff8e);
    auVar24._12_4_ = -(uint)(iVar19 < -0x7fffff8e);
    auVar15._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar15._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar15._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar15._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar15 = auVar15 & auVar24;
    auVar14 = pshuflw(auVar20,auVar15,0xe8);
    auVar14 = packssdw(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      p->posEncoders[lVar4] = 0x400;
    }
    auVar14 = packssdw(auVar15,auVar15);
    auVar14 = packssdw(auVar14,auVar14);
    if ((auVar14._0_4_ >> 0x10 & 1) != 0) {
      p->posEncoders[lVar4 + 1] = 0x400;
    }
    auVar14 = auVar12 ^ auVar2;
    iVar3 = auVar14._0_4_;
    iVar19 = auVar14._8_4_;
    auVar21._4_4_ = iVar3;
    auVar21._0_4_ = iVar3;
    auVar21._8_4_ = iVar19;
    auVar21._12_4_ = iVar19;
    auVar25._0_4_ = -(uint)(iVar3 < -0x7fffff8e);
    auVar25._4_4_ = -(uint)(iVar3 < -0x7fffff8e);
    auVar25._8_4_ = -(uint)(iVar19 < -0x7fffff8e);
    auVar25._12_4_ = -(uint)(iVar19 < -0x7fffff8e);
    auVar16._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar16._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar16._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar16._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar16 = auVar16 & auVar25;
    auVar14 = packssdw(auVar21,auVar16);
    auVar14 = packssdw(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      p->posEncoders[lVar4 + 2] = 0x400;
    }
    auVar14 = pshufhw(auVar16,auVar16,0x84);
    auVar14 = packssdw(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      p->posEncoders[lVar4 + 3] = 0x400;
    }
    auVar14 = auVar11 ^ auVar2;
    iVar3 = auVar14._0_4_;
    iVar19 = auVar14._8_4_;
    auVar22._4_4_ = iVar3;
    auVar22._0_4_ = iVar3;
    auVar22._8_4_ = iVar19;
    auVar22._12_4_ = iVar19;
    auVar26._0_4_ = -(uint)(iVar3 < -0x7fffff8e);
    auVar26._4_4_ = -(uint)(iVar3 < -0x7fffff8e);
    auVar26._8_4_ = -(uint)(iVar19 < -0x7fffff8e);
    auVar26._12_4_ = -(uint)(iVar19 < -0x7fffff8e);
    auVar17._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar17._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar17._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar17._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar17 = auVar17 & auVar26;
    auVar14 = pshuflw(auVar22,auVar17,0xe8);
    auVar14 = packssdw(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      p->posEncoders[lVar4 + 4] = 0x400;
    }
    auVar14 = packssdw(auVar17,auVar17);
    auVar14 = packssdw(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      p->posEncoders[lVar4 + 5] = 0x400;
    }
    auVar14 = auVar10 ^ auVar2;
    iVar3 = auVar14._0_4_;
    iVar19 = auVar14._8_4_;
    auVar23._4_4_ = iVar3;
    auVar23._0_4_ = iVar3;
    auVar23._8_4_ = iVar19;
    auVar23._12_4_ = iVar19;
    auVar27._0_4_ = -(uint)(iVar3 < -0x7fffff8e);
    auVar27._4_4_ = -(uint)(iVar3 < -0x7fffff8e);
    auVar27._8_4_ = -(uint)(iVar19 < -0x7fffff8e);
    auVar27._12_4_ = -(uint)(iVar19 < -0x7fffff8e);
    auVar18._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar18._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar18._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar18._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar18 = auVar18 & auVar27;
    auVar14 = packssdw(auVar23,auVar18);
    auVar14 = packssdw(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      p->posEncoders[lVar4 + 6] = 0x400;
    }
    auVar14 = pshufhw(auVar18,auVar18,0x84);
    auVar14 = packssdw(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      p->posEncoders[lVar4 + 7] = 0x400;
    }
    lVar4 = lVar4 + 8;
    lVar9 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + 8;
    auVar13._8_8_ = lVar9 + 8;
    lVar9 = auVar12._8_8_;
    auVar12._0_8_ = auVar12._0_8_ + 8;
    auVar12._8_8_ = lVar9 + 8;
    lVar9 = auVar11._8_8_;
    auVar11._0_8_ = auVar11._0_8_ + 8;
    auVar11._8_8_ = lVar9 + 8;
    lVar9 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 8;
    auVar10._8_8_ = lVar9 + 8;
  } while (lVar4 != 0x78);
  (p->lenEnc).p.choice = 0x400;
  (p->lenEnc).p.choice2 = 0x400;
  lVar4 = 0;
  do {
    pUVar1 = (p->lenEnc).p.low + lVar4;
    pUVar1[0] = 0x400;
    pUVar1[1] = 0x400;
    pUVar1[2] = 0x400;
    pUVar1[3] = 0x400;
    pUVar1[4] = 0x400;
    pUVar1[5] = 0x400;
    pUVar1[6] = 0x400;
    pUVar1[7] = 0x400;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x80);
  lVar4 = 0;
  do {
    pUVar1 = (p->lenEnc).p.mid + lVar4;
    pUVar1[0] = 0x400;
    pUVar1[1] = 0x400;
    pUVar1[2] = 0x400;
    pUVar1[3] = 0x400;
    pUVar1[4] = 0x400;
    pUVar1[5] = 0x400;
    pUVar1[6] = 0x400;
    pUVar1[7] = 0x400;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x80);
  lVar4 = 0;
  do {
    pUVar1 = (p->lenEnc).p.high + lVar4;
    pUVar1[0] = 0x400;
    pUVar1[1] = 0x400;
    pUVar1[2] = 0x400;
    pUVar1[3] = 0x400;
    pUVar1[4] = 0x400;
    pUVar1[5] = 0x400;
    pUVar1[6] = 0x400;
    pUVar1[7] = 0x400;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x100);
  (p->repLenEnc).p.choice = 0x400;
  (p->repLenEnc).p.choice2 = 0x400;
  lVar4 = 0;
  do {
    pUVar1 = (p->repLenEnc).p.low + lVar4;
    pUVar1[0] = 0x400;
    pUVar1[1] = 0x400;
    pUVar1[2] = 0x400;
    pUVar1[3] = 0x400;
    pUVar1[4] = 0x400;
    pUVar1[5] = 0x400;
    pUVar1[6] = 0x400;
    pUVar1[7] = 0x400;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x80);
  lVar4 = 0;
  do {
    pUVar1 = (p->repLenEnc).p.mid + lVar4;
    pUVar1[0] = 0x400;
    pUVar1[1] = 0x400;
    pUVar1[2] = 0x400;
    pUVar1[3] = 0x400;
    pUVar1[4] = 0x400;
    pUVar1[5] = 0x400;
    pUVar1[6] = 0x400;
    pUVar1[7] = 0x400;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x80);
  lVar4 = 0;
  do {
    pUVar1 = (p->repLenEnc).p.high + lVar4;
    pUVar1[0] = 0x400;
    pUVar1[1] = 0x400;
    pUVar1[2] = 0x400;
    pUVar1[3] = 0x400;
    pUVar1[4] = 0x400;
    pUVar1[5] = 0x400;
    pUVar1[6] = 0x400;
    pUVar1[7] = 0x400;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x100);
  lVar4 = 0;
  do {
    pUVar1 = p->posAlignEncoder + lVar4;
    pUVar1[0] = 0x400;
    pUVar1[1] = 0x400;
    pUVar1[2] = 0x400;
    pUVar1[3] = 0x400;
    pUVar1[4] = 0x400;
    pUVar1[5] = 0x400;
    pUVar1[6] = 0x400;
    pUVar1[7] = 0x400;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x10);
  p->optimumEndIndex = 0;
  p->optimumCurrentIndex = 0;
  p->additionalOffset = 0;
  p->pbMask = ~(-1 << ((byte)p->pb & 0x1f));
  p->lpMask = ~(-1 << ((byte)p->lp & 0x1f));
  return;
}

Assistant:

void LzmaEnc_Init(CLzmaEnc* p) {
  UInt32 i;
  p->state = 0;
  for (i = 0; i < LZMA_NUM_REPS; i++)
    p->reps[i] = 0;

  RangeEnc_Init(&p->rc);

  for (i = 0; i < kNumStates; i++) {
    UInt32 j;
    for (j = 0; j < LZMA_NUM_PB_STATES_MAX; j++) {
      p->isMatch[i][j] = kProbInitValue;
      p->isRep0Long[i][j] = kProbInitValue;
    }
    p->isRep[i] = kProbInitValue;
    p->isRepG0[i] = kProbInitValue;
    p->isRepG1[i] = kProbInitValue;
    p->isRepG2[i] = kProbInitValue;
  }

  {
    UInt32 num = 0x300 << (p->lp + p->lc);
    for (i = 0; i < num; i++)
      p->litProbs[i] = kProbInitValue;
  }

  {
    for (i = 0; i < kNumLenToPosStates; i++) {
      CLzmaProb* probs = p->posSlotEncoder[i];
      UInt32 j;
      for (j = 0; j < (1 << kNumPosSlotBits); j++)
        probs[j] = kProbInitValue;
    }
  }
  {
    for (i = 0; i < kNumFullDistances - kEndPosModelIndex; i++)
      p->posEncoders[i] = kProbInitValue;
  }

  LenEnc_Init(&p->lenEnc.p);
  LenEnc_Init(&p->repLenEnc.p);

  for (i = 0; i < (1 << kNumAlignBits); i++)
    p->posAlignEncoder[i] = kProbInitValue;

  p->optimumEndIndex = 0;
  p->optimumCurrentIndex = 0;
  p->additionalOffset = 0;

  p->pbMask = (1 << p->pb) - 1;
  p->lpMask = (1 << p->lp) - 1;
}